

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof_lambda_auto.cpp
# Opt level: O0

void __thiscall tst_cpp14_argsof_lambda_auto::lambdaAutoArgs(tst_cpp14_argsof_lambda_auto *this)

{
  anon_class_1_0_00000001 lMutable;
  anon_class_1_0_00000001 lManyArgs;
  anon_class_1_0_00000001 lOneArg;
  tst_cpp14_argsof_lambda_auto *this_local;
  
  return;
}

Assistant:

void tst_cpp14_argsof_lambda_auto::lambdaAutoArgs()
{
    auto lOneArg = [](auto) {};
    auto lManyArgs = [](const auto&, auto, auto) {};
    auto lMutable = [](const auto&, auto) mutable {};

    Q_STATIC_ASSERT((ArgsOf<decltype(lOneArg)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lManyArgs)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lMutable)>::count == 0));
}